

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Option<Catch::SectionTracking::TestCaseTracker>::reset
          (Option<Catch::SectionTracking::TestCaseTracker> *this)

{
  if (this->nullableValue != (TestCaseTracker *)0x0) {
    SectionTracking::TrackedSection::~TrackedSection(&this->nullableValue->m_testCase);
  }
  this->nullableValue = (TestCaseTracker *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = NULL;
        }